

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# partition_strategy.c
# Opt level: O0

void simple_motion_search_based_split
               (AV1_COMP *cpi,MACROBLOCK *x,SIMPLE_MOTION_DATA_TREE *sms_tree,
               PartitionSearchState *part_state)

{
  _Bool _Var1;
  PartitionSearchState *in_RCX;
  SIMPLE_MOTION_DATA_TREE *in_RDX;
  MACROBLOCK *in_RSI;
  AV1_COMP *in_RDI;
  float *in_stack_00000010;
  int in_stack_00000018;
  float rect_split_thresh;
  float scale;
  float score;
  int idx;
  float features [17];
  float no_split_thresh;
  float split_only_thresh;
  int agg;
  NN_CONFIG *nn_config;
  float *ml_std;
  float *ml_mean;
  int res_idx;
  int is_480p_or_larger;
  int is_720p_or_larger;
  int bsize_idx;
  BLOCK_SIZE bsize;
  int mi_col;
  int mi_row;
  PartitionBlkParams *blk_params;
  AV1_COMMON *cm;
  int *in_stack_00002a60;
  int *in_stack_00002a68;
  int *in_stack_00002a70;
  int *in_stack_00002a78;
  float *in_stack_00002a80;
  AV1_COMP *in_stack_00002a88;
  int *in_stack_00002aa0;
  float local_d4;
  int local_d0;
  int local_cc;
  float local_c0;
  int local_bc;
  float local_b8 [17];
  float local_74;
  float local_70;
  int local_6c;
  NN_CONFIG *local_68;
  float *local_60;
  float *local_58;
  int local_4c;
  uint local_48;
  uint local_44;
  int local_40;
  BLOCK_SIZE local_39;
  int local_38;
  int local_34;
  PartitionBlkParams *local_30;
  AV1_COMMON *pAVar2;
  BLOCK_SIZE bsize_00;
  
  pAVar2 = &in_RDI->common;
  local_30 = &in_RCX->part_blk_params;
  local_34 = (in_RCX->part_blk_params).mi_row;
  local_38 = (in_RCX->part_blk_params).mi_col;
  local_39 = (in_RCX->part_blk_params).bsize;
  local_40 = convert_bsize_to_idx(local_39);
  if (pAVar2->width < pAVar2->height) {
    local_cc = pAVar2->width;
  }
  else {
    local_cc = pAVar2->height;
  }
  local_44 = (uint)(0x2cf < local_cc);
  if (pAVar2->width < pAVar2->height) {
    local_d0 = pAVar2->width;
  }
  else {
    local_d0 = pAVar2->height;
  }
  local_48 = (uint)(0x1df < local_d0);
  local_4c = local_48 + local_44;
  local_58 = av1_simple_motion_search_split_mean[local_40];
  local_60 = av1_simple_motion_search_split_std[local_40];
  local_68 = av1_simple_motion_search_split_nn_config[local_40];
  local_6c = get_simple_motion_search_prune_agg
                       (in_RSI->qindex,(in_RDI->sf).part_sf.simple_motion_search_prune_agg,0);
  bsize_00 = (BLOCK_SIZE)((ulong)pAVar2 >> 0x38);
  if (-1 < local_6c) {
    local_70 = av1_simple_motion_search_split_thresh[local_6c][local_4c][local_40];
    local_74 = av1_simple_motion_search_no_split_thresh[local_6c][local_4c][local_40];
    memset(local_b8,0,0x44);
    simple_motion_search_prune_part_features
              (in_RDI,in_RSI,in_RDX,(int)((ulong)in_RCX >> 0x20),(int)in_RCX,bsize_00,
               in_stack_00000010,in_stack_00000018);
    write_features_to_file
              ((char *)features._48_8_,features[0xb]._3_1_,(float *)features._32_8_,(int)features[7]
               ,(int)features[6],features[5]._3_1_,(int)features[0x10],(int)split_only_thresh);
    _Var1 = ext_ml_model_decision_before_none
                      (in_stack_00002a88,in_stack_00002a80,in_stack_00002a78,in_stack_00002a70,
                       in_stack_00002a68,in_stack_00002a60,in_stack_00002aa0);
    if (!_Var1) {
      for (local_bc = 0; local_bc < 0x11; local_bc = local_bc + 1) {
        local_b8[local_bc] = (local_b8[local_bc] - local_58[local_bc]) / local_60[local_bc];
      }
      local_c0 = 0.0;
      (*av1_nn_predict)(local_b8,local_68,1,&local_c0);
      if (local_70 < local_c0) {
        av1_set_square_split_only((PartitionSearchState *)0x5ba591);
      }
      if ((1 < (in_RDI->sf).part_sf.simple_motion_search_split) && (local_c0 < local_74)) {
        av1_disable_square_split_partition(in_RCX);
      }
      if ((in_RDI->sf).part_sf.simple_motion_search_rect_split != 0) {
        local_d4 = 3.0;
        if (local_4c < 2) {
          local_d4 = 2.0;
        }
        if (local_c0 <
            local_d4 *
            av1_simple_motion_search_no_split_thresh
            [(in_RDI->sf).part_sf.simple_motion_search_rect_split][local_4c][local_40]) {
          in_RCX->do_rectangular_split = 0;
        }
      }
    }
  }
  return;
}

Assistant:

static void simple_motion_search_based_split(AV1_COMP *const cpi, MACROBLOCK *x,
                                             SIMPLE_MOTION_DATA_TREE *sms_tree,
                                             PartitionSearchState *part_state) {
  const AV1_COMMON *const cm = &cpi->common;
  const PartitionBlkParams *blk_params = &part_state->part_blk_params;
  const int mi_row = blk_params->mi_row, mi_col = blk_params->mi_col;
  const BLOCK_SIZE bsize = blk_params->bsize;

  const int bsize_idx = convert_bsize_to_idx(bsize);
  const int is_720p_or_larger = AOMMIN(cm->width, cm->height) >= 720;
  const int is_480p_or_larger = AOMMIN(cm->width, cm->height) >= 480;
  // res_idx is 0 for res < 480p, 1 for 480p, 2 for 720p+
  const int res_idx = is_480p_or_larger + is_720p_or_larger;

  assert(bsize_idx >= 0 && bsize_idx <= 4 &&
         "Invalid bsize in simple_motion_search_based_split");

  const float *ml_mean = av1_simple_motion_search_split_mean[bsize_idx];
  const float *ml_std = av1_simple_motion_search_split_std[bsize_idx];
  const NN_CONFIG *nn_config =
      av1_simple_motion_search_split_nn_config[bsize_idx];

  const int agg = get_simple_motion_search_prune_agg(
      x->qindex, cpi->sf.part_sf.simple_motion_search_prune_agg, 0);
  if (agg < 0) {
    return;
  }

  const float split_only_thresh =
      av1_simple_motion_search_split_thresh[agg][res_idx][bsize_idx];
  const float no_split_thresh =
      av1_simple_motion_search_no_split_thresh[agg][res_idx][bsize_idx];

  float features[FEATURE_SIZE_SMS_SPLIT] = { 0.0f };
  simple_motion_search_prune_part_features(cpi, x, sms_tree, mi_row, mi_col,
                                           bsize, features,
                                           FEATURE_SMS_SPLIT_MODEL_FLAG);

  // Write features to file
  write_features_to_file(cpi->oxcf.partition_info_path,
                         cpi->ext_part_controller.test_mode, features,
                         FEATURE_SIZE_SMS_SPLIT, 0, bsize, mi_row, mi_col);

  // Note: it is intended to not normalize the features here, to keep it
  // consistent for all features collected and passed to the external model.
  if (ext_ml_model_decision_before_none(
          cpi, features, &part_state->partition_none_allowed,
          &part_state->partition_rect_allowed[HORZ],
          &part_state->partition_rect_allowed[VERT],
          &part_state->do_rectangular_split, &part_state->do_square_split)) {
    return;
  }

  for (int idx = 0; idx < FEATURE_SIZE_SMS_SPLIT; idx++) {
    features[idx] = (features[idx] - ml_mean[idx]) / ml_std[idx];
  }

  float score = 0.0f;

  av1_nn_predict(features, nn_config, 1, &score);

  if (score > split_only_thresh) {
    av1_set_square_split_only(part_state);
  }

  if (cpi->sf.part_sf.simple_motion_search_split >= 2 &&
      score < no_split_thresh) {
    av1_disable_square_split_partition(part_state);
  }

  // If the score is very low, prune rectangular split since it is unlikely to
  // occur.
  if (cpi->sf.part_sf.simple_motion_search_rect_split) {
    const float scale = res_idx >= 2 ? 3.0f : 2.0f;
    const float rect_split_thresh =
        scale * av1_simple_motion_search_no_split_thresh
                    [cpi->sf.part_sf.simple_motion_search_rect_split][res_idx]
                    [bsize_idx];
    if (score < rect_split_thresh) {
      part_state->do_rectangular_split = 0;
    }
  }
}